

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_opldumper_mididevice.cpp
# Opt level: O2

void __thiscall OPL_RDOSdump::SetClockRate(OPL_RDOSdump *this,double samples_per_tick)

{
  int iVar1;
  undefined8 in_RAX;
  double dVar2;
  undefined4 uStack_18;
  BYTE clock_change [4];
  
  (this->super_OPLDump).TimePerTick = samples_per_tick * 0.020114248933944805;
  iVar1 = 1;
  do {
    dVar2 = (samples_per_tick * 24.0) / (double)iVar1 + 0.5;
    iVar1 = iVar1 + 1;
  } while (65535.0 < dVar2);
  iVar1 = (int)dVar2;
  if ((this->super_OPLDump).field_0x29 == '\x01') {
    clock_change = SUB84((ulong)in_RAX >> 0x20,0);
    uStack_18 = CONCAT22((short)iVar1,(short)in_RAX);
    fseek((FILE *)(this->super_OPLDump).File,8,0);
    fwrite((void *)((long)&uStack_18 + 2),2,1,(FILE *)(this->super_OPLDump).File);
    fseek((FILE *)(this->super_OPLDump).File,0,2);
    (this->super_OPLDump).field_0x29 = 0;
  }
  else {
    uStack_18 = (undefined4)in_RAX;
    _uStack_18 = CONCAT17((char)((uint)iVar1 >> 8),CONCAT16((char)iVar1,CONCAT24(0x200,uStack_18)));
    fwrite(clock_change,1,4,(FILE *)(this->super_OPLDump).File);
  }
  return;
}

Assistant:

virtual void SetClockRate(double samples_per_tick)
	{
		TimePerTick = samples_per_tick / OPL_SAMPLE_RATE * 1000.0;

		double clock_rate;
		int clock_mul;
		WORD clock_word;

		clock_rate = samples_per_tick * ADLIB_CLOCK_MUL;
		clock_mul = 1;

		// The RDos raw format's clock rate is stored in a word. Therefore,
		// the longest tick that can be stored is only ~55 ms.
		while (clock_rate / clock_mul + 0.5 > 65535.0)
		{
			clock_mul++;
		}
		clock_word = WORD(clock_rate / clock_mul + 0.5);

		if (NeedClockRate)
		{ // Set the initial clock rate.
			clock_word = LittleShort(clock_word);
			fseek(File, 8, SEEK_SET);
			fwrite(&clock_word, 2, 1, File);
			fseek(File, 0, SEEK_END);
			NeedClockRate = false;
		}
		else
		{ // Change the clock rate in the middle of the song.
			BYTE clock_change[4] = { 0, 2, BYTE(clock_word & 255), BYTE(clock_word >> 8) };
			fwrite(clock_change, 1, 4, File);
		}
	}